

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *input,bool allow_non_standard)

{
  bool bVar1;
  reference pbVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uVar6;
  byte in_DL;
  undefined8 in_RSI;
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  string *in_stack_fffffffffffffd28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5c;
  byte in_stack_fffffffffffffd5d;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  string local_230 [39];
  undefined1 local_209;
  string local_208 [39];
  undefined1 local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9;
  string local_1b8 [32];
  string local_198 [39];
  byte local_171;
  string local_170 [39];
  undefined1 local_149;
  string local_148 [39];
  undefined1 local_121;
  string local_120 [39];
  undefined1 local_f9;
  string local_f8 [32];
  string local_d8 [36];
  undefined4 local_b4;
  undefined4 local_b0;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  undefined8 local_70;
  string local_68 [87];
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14d822);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14d82f);
  ::std::__cxx11::string::string(local_68);
  local_70 = local_10;
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffd18);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd18);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd18);
    if (!bVar1) {
      ::std::
      make_tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd28,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 in_stack_fffffffffffffd18);
      local_b0 = 1;
      ::std::__cxx11::string::~string(local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd30);
      return in_RDI;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_78);
    ::std::__cxx11::string::string(local_a0,(string *)pbVar2);
    lVar3 = ::std::__cxx11::string::length();
    if (lVar3 == 0) {
      local_b0 = 3;
    }
    else {
      uVar4 = ::std::__cxx11::string::length();
      if (((uVar4 < 2) ||
          (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0), *pcVar5 != '-')) ||
         (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0), *pcVar5 == '-')) {
        uVar4 = ::std::__cxx11::string::length();
        local_171 = 0;
        in_stack_fffffffffffffd5d = false;
        if (2 < uVar4) {
          ::std::__cxx11::string::substr((ulong)local_170,(ulong)local_a0);
          local_171 = 1;
          in_stack_fffffffffffffd5e =
               ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                                 (char *)in_stack_fffffffffffffd18);
          in_stack_fffffffffffffd5d = in_stack_fffffffffffffd5e;
        }
        in_stack_fffffffffffffd5f = in_stack_fffffffffffffd5d;
        if ((local_171 & 1) != 0) {
          ::std::__cxx11::string::~string(local_170);
        }
        if ((in_stack_fffffffffffffd5d & 1) == 0) {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20)
                                    ,(char *)in_stack_fffffffffffffd18);
          if (((bVar1) ||
              (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_fffffffffffffd27,
                                                     in_stack_fffffffffffffd20),
                                         (char *)in_stack_fffffffffffffd18), bVar1)) ||
             (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffd27,
                                                    in_stack_fffffffffffffd20),
                                        (char *)in_stack_fffffffffffffd18), bVar1)) {
            local_1e1 = 1;
            uVar6 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string(local_1e0,local_a0);
            BadNameString::ReservedName
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))));
            local_1e1 = 0;
            __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          uVar4 = ::std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_209 = 1;
            uVar6 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string(local_208,local_a0);
            BadNameString::MultiPositionalNames
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))));
            local_209 = 0;
            __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          in_stack_fffffffffffffd27 = valid_name_string(in_stack_fffffffffffffd28);
          if (!(bool)in_stack_fffffffffffffd27) {
            uVar6 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string(local_230,local_a0);
            BadNameString::BadPositionalName
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))));
            __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          ::std::__cxx11::string::operator=(local_68,local_a0);
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_198,(ulong)local_a0);
          ::std::__cxx11::string::operator=(local_a0,local_198);
          ::std::__cxx11::string::~string(local_198);
          in_stack_fffffffffffffd5c = valid_name_string(in_stack_fffffffffffffd28);
          if (!(bool)in_stack_fffffffffffffd5c) {
            local_1b9 = 1;
            uVar6 = __cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string(local_1b8,local_a0);
            BadNameString::BadLongName
                      ((string *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))));
            local_1b9 = 0;
            __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        }
      }
      else {
        lVar3 = ::std::__cxx11::string::length();
        if (lVar3 == 2) {
          pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0);
          bVar1 = valid_first_char<char>(*pcVar5);
          if (bVar1) {
            local_b4 = 1;
            ::std::__cxx11::string::operator[]((ulong)local_a0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char&>
                      (in_stack_fffffffffffffd30,(int *)in_stack_fffffffffffffd28,
                       (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
            goto LAB_0014e1f6;
          }
        }
        uVar4 = ::std::__cxx11::string::length();
        if (uVar4 < 3) {
          local_149 = 1;
          uVar6 = __cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string(local_148,local_a0);
          BadNameString::OneCharName
                    ((string *)
                     CONCAT17(in_stack_fffffffffffffd5f,
                              CONCAT16(in_stack_fffffffffffffd5e,
                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                         in_stack_fffffffffffffd58)))));
          local_149 = 0;
          __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        if ((local_11 & 1) == 0) {
          local_121 = 1;
          uVar6 = __cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string(local_120,local_a0);
          BadNameString::MissingDash
                    ((string *)
                     CONCAT17(in_stack_fffffffffffffd5f,
                              CONCAT16(in_stack_fffffffffffffd5e,
                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                         in_stack_fffffffffffffd58)))));
          local_121 = 0;
          __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        ::std::__cxx11::string::substr((ulong)local_d8,(ulong)local_a0);
        ::std::__cxx11::string::operator=(local_a0,local_d8);
        ::std::__cxx11::string::~string(local_d8);
        bVar1 = valid_name_string(in_stack_fffffffffffffd28);
        if (!bVar1) {
          local_f9 = 1;
          uVar6 = __cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string(local_f8,local_a0);
          BadNameString::BadLongName
                    ((string *)
                     CONCAT17(in_stack_fffffffffffffd5f,
                              CONCAT16(in_stack_fffffffffffffd5e,
                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                         in_stack_fffffffffffffd58)))));
          local_f9 = 0;
          __cxa_throw(uVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      }
LAB_0014e1f6:
      local_b0 = 0;
    }
    ::std::__cxx11::string::~string(local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_78);
  } while( true );
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input, bool allow_non_standard) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1])) {
                short_names.emplace_back(1, name[1]);
            } else if(name.length() > 2) {
                if(allow_non_standard) {
                    name = name.substr(1);
                    if(valid_name_string(name)) {
                        short_names.push_back(name);
                    } else {
                        throw BadNameString::BadLongName(name);
                    }
                } else {
                    throw BadNameString::MissingDash(name);
                }
            } else {
                throw BadNameString::OneCharName(name);
            }
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name)) {
                long_names.push_back(name);
            } else {
                throw BadNameString::BadLongName(name);
            }
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty()) {
                throw BadNameString::MultiPositionalNames(name);
            }
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}